

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEFilter<duckdb::hugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  char cVar1;
  uint uVar2;
  _func_int *p_Var3;
  data_ptr_t pdVar4;
  undefined8 uVar5;
  idx_t result_end;
  pointer pSVar6;
  _func_int *dataptr;
  _func_int **pp_Var7;
  ulong uVar8;
  InternalException *this;
  long lVar9;
  ulong uVar10;
  idx_t iVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  data_ptr_t pdVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  _func_int **pp_Var19;
  SelectionVector matching_sel;
  SelectionVector run_matches;
  Vector run_vector;
  undefined1 local_120 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  SelectionVector local_d8;
  undefined1 local_b8 [8];
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psStack_b0;
  undefined1 local_a8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  LogicalType local_48;
  
  pSVar6 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar6 + 3));
  p_Var3 = pSVar6[3]._vptr_SegmentScanState[2];
  iVar11 = segment->offset;
  dataptr = p_Var3 + iVar11 + 8;
  uVar2 = *(uint *)&pSVar6[6]._vptr_SegmentScanState;
  if (pSVar6[7]._vptr_SegmentScanState == (_func_int **)0x0) {
    pp_Var19 = (_func_int **)((ulong)uVar2 - 8 >> 4);
    pp_Var7 = (_func_int **)operator_new__((ulong)pp_Var19);
    switchD_0105b559::default(pp_Var7,0,(size_t)pp_Var19);
    pp_Var12 = pSVar6[7]._vptr_SegmentScanState;
    pSVar6[7]._vptr_SegmentScanState = pp_Var7;
    if (pp_Var12 != (_func_int **)0x0) {
      operator_delete__(pp_Var12);
    }
    switchD_0105b559::default(pSVar6[7]._vptr_SegmentScanState,0,(size_t)pp_Var19);
    LogicalType::LogicalType(&local_48,&result->type);
    Vector::Vector((Vector *)local_b8,&local_48,(data_ptr_t)dataptr);
    LogicalType::~LogicalType(&local_48);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_120);
    Vector::ToUnifiedFormat((Vector *)local_b8,(idx_t)pp_Var19,(UnifiedVectorFormat *)local_120);
    local_d8.sel_vector = (sel_t *)0x0;
    local_d8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar6[8]._vptr_SegmentScanState = pp_Var19;
    ColumnSegment::FilterSelection
              (&local_d8,(Vector *)local_b8,(UnifiedVectorFormat *)local_120,filter,filter_state,
               (idx_t)pp_Var19,(idx_t *)(pSVar6 + 8));
    pp_Var12 = pSVar6[8]._vptr_SegmentScanState;
    if (pp_Var12 != (_func_int **)0x0) {
      pp_Var7 = pSVar6[7]._vptr_SegmentScanState;
      pp_Var19 = (_func_int **)0x0;
      do {
        pp_Var13 = pp_Var19;
        if (local_d8.sel_vector != (sel_t *)0x0) {
          pp_Var13 = (_func_int **)(ulong)local_d8.sel_vector[(long)pp_Var19];
        }
        *(undefined1 *)((long)pp_Var7 + (long)pp_Var13) = 1;
        pp_Var19 = (_func_int **)((long)pp_Var19 + 1);
      } while (pp_Var12 != pp_Var19);
    }
    if (local_d8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
    if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
    }
    if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)&psStack_b0);
  }
  if (pSVar6[8]._vptr_SegmentScanState == (_func_int **)0x0) {
    *sel_count = 0;
  }
  else {
    lVar9 = iVar11 + uVar2;
    pdVar4 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector((SelectionVector *)local_120,*sel_count);
    uVar18 = *sel_count;
    if (sel->sel_vector == (sel_t *)0x0) {
      uVar15 = 0;
      iVar11 = 0;
      do {
        uVar8 = uVar18 - uVar15;
        if (uVar18 < uVar15 || uVar8 == 0) break;
        pp_Var12 = pSVar6[4]._vptr_SegmentScanState;
        uVar10 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) -
                 (long)pSVar6[5]._vptr_SegmentScanState;
        local_b8 = *(undefined1 (*) [8])(dataptr + (long)pp_Var12 * 0x10);
        psStack_b0 = *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)
                      (dataptr + (long)pp_Var12 * 0x10 + 8);
        cVar1 = *(char *)((long)pSVar6[7]._vptr_SegmentScanState + (long)pp_Var12);
        if (uVar8 < uVar10) {
          if (cVar1 != '\0') {
            pdVar14 = pdVar4 + uVar15 * 0x10;
            uVar17 = uVar15;
            do {
              *(undefined1 (*) [8])pdVar14 = local_b8;
              *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)(pdVar14 + 8) = psStack_b0;
              *(sel_t *)((long)(sel_t **)local_120._0_8_ + iVar11 * 4) = (sel_t)uVar17;
              iVar11 = iVar11 + 1;
              uVar17 = uVar17 + 1;
              pdVar14 = pdVar14 + 0x10;
            } while (uVar18 != uVar17);
          }
          pp_Var12 = (_func_int **)((long)pSVar6[5]._vptr_SegmentScanState + uVar8);
        }
        else {
          if (((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) !=
               pSVar6[5]._vptr_SegmentScanState) && (cVar1 != '\0')) {
            pdVar14 = pdVar4 + uVar15 * 0x10;
            uVar16 = uVar15 & 0xffffffff;
            uVar17 = uVar10;
            do {
              *(undefined1 (*) [8])pdVar14 = local_b8;
              *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)(pdVar14 + 8) = psStack_b0;
              *(sel_t *)((long)(sel_t **)local_120._0_8_ + iVar11 * 4) = (sel_t)uVar16;
              iVar11 = iVar11 + 1;
              uVar16 = (ulong)((sel_t)uVar16 + 1);
              pdVar14 = pdVar14 + 0x10;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          uVar15 = uVar15 + uVar10;
          pSVar6[4]._vptr_SegmentScanState =
               (_func_int **)((long)pSVar6[4]._vptr_SegmentScanState + 1);
          pp_Var12 = (_func_int **)0x0;
        }
        pSVar6[5]._vptr_SegmentScanState = pp_Var12;
      } while (uVar10 <= uVar8);
    }
    else {
      if (uVar18 == 0) {
        iVar11 = 0;
        uVar18 = 0;
      }
      else {
        uVar8 = 0;
        iVar11 = 0;
        uVar15 = 0;
        do {
          uVar18 = uVar8;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar18 = (ulong)sel->sel_vector[uVar8];
          }
          uVar10 = uVar18 - uVar15;
          if (uVar18 < uVar15) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_b8 = (undefined1  [8])local_a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,
                       "Error in RLEFilter - selection vector indices are not ordered","");
            InternalException::InternalException(this,(string *)local_b8);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (uVar10 != 0) {
            pp_Var12 = pSVar6[4]._vptr_SegmentScanState;
            pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
            do {
              uVar15 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) - (long)pp_Var7
              ;
              if (uVar10 < uVar15) {
                uVar15 = uVar10;
              }
              pp_Var7 = (_func_int **)((long)pp_Var7 + uVar15);
              if ((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) <= pp_Var7)
              {
                pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
                pSVar6[4]._vptr_SegmentScanState = pp_Var12;
                pp_Var7 = (_func_int **)0x0;
              }
              uVar10 = uVar10 - uVar15;
            } while (uVar10 != 0);
            pSVar6[5]._vptr_SegmentScanState = pp_Var7;
          }
          if (*(char *)((long)pSVar6[7]._vptr_SegmentScanState +
                       (long)pSVar6[4]._vptr_SegmentScanState) == '\x01') {
            uVar5 = *(undefined8 *)(dataptr + (long)pSVar6[4]._vptr_SegmentScanState * 0x10 + 8);
            *(undefined8 *)(pdVar4 + uVar18 * 0x10) =
                 *(undefined8 *)(dataptr + (long)pSVar6[4]._vptr_SegmentScanState * 0x10);
            *(undefined8 *)(pdVar4 + uVar18 * 0x10 + 8) = uVar5;
            *(sel_t *)((long)(sel_t **)local_120._0_8_ + iVar11 * 4) = (sel_t)uVar18;
            iVar11 = iVar11 + 1;
          }
          uVar8 = uVar8 + 1;
          uVar15 = uVar18;
        } while (uVar8 < *sel_count);
      }
      uVar18 = vector_count - uVar18;
      if (uVar18 != 0) {
        pp_Var12 = pSVar6[4]._vptr_SegmentScanState;
        pp_Var7 = pSVar6[5]._vptr_SegmentScanState;
        do {
          uVar15 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) - (long)pp_Var7;
          if (uVar18 < uVar15) {
            uVar15 = uVar18;
          }
          pp_Var7 = (_func_int **)((long)pp_Var7 + uVar15);
          if ((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var12 * 2 + lVar9) <= pp_Var7) {
            pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
            pSVar6[4]._vptr_SegmentScanState = pp_Var12;
            pp_Var7 = (_func_int **)0x0;
          }
          uVar18 = uVar18 - uVar15;
        } while (uVar18 != 0);
        pSVar6[5]._vptr_SegmentScanState = pp_Var7;
      }
    }
    if (iVar11 != *sel_count) {
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_120 + 8));
      sel->sel_vector = (sel_t *)local_120._0_8_;
      *sel_count = iVar11;
    }
    if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
    }
  }
  return;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}